

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::commandsInit(Sandbox *this,CommandList *_commands)

{
  CommandList *pCVar1;
  allocator local_2521;
  string local_2520;
  allocator local_24f9;
  string local_24f8;
  anon_class_8_1_8991fb9c local_24d8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_24d0;
  allocator local_24a9;
  string local_24a8;
  Command local_2488;
  allocator local_23f9;
  string local_23f8;
  allocator local_23d1;
  string local_23d0;
  anon_class_8_1_8991fb9c local_23b0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_23a8;
  allocator local_2381;
  string local_2380;
  Command local_2360;
  allocator local_22d1;
  string local_22d0;
  allocator local_22a9;
  string local_22a8;
  anon_class_8_1_8991fb9c local_2288;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2280;
  allocator local_2259;
  string local_2258;
  Command local_2238;
  allocator local_21a9;
  string local_21a8;
  allocator local_2181;
  string local_2180;
  anon_class_8_1_8991fb9c local_2160;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2158;
  allocator local_2131;
  string local_2130;
  Command local_2110;
  allocator local_2081;
  string local_2080;
  allocator local_2059;
  string local_2058;
  anon_class_8_1_8991fb9c local_2038;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_2030;
  allocator local_2009;
  string local_2008;
  Command local_1fe8;
  allocator local_1f59;
  string local_1f58;
  allocator local_1f31;
  string local_1f30;
  anon_class_8_1_8991fb9c local_1f10;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1f08;
  allocator local_1ee1;
  string local_1ee0;
  Command local_1ec0;
  allocator local_1e31;
  string local_1e30;
  allocator local_1e09;
  string local_1e08;
  anon_class_8_1_8991fb9c local_1de8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1de0;
  allocator local_1db9;
  string local_1db8;
  Command local_1d98;
  allocator local_1d09;
  string local_1d08;
  allocator local_1ce1;
  string local_1ce0;
  anon_class_8_1_8991fb9c local_1cc0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1cb8;
  allocator local_1c91;
  string local_1c90;
  Command local_1c70;
  allocator local_1be1;
  string local_1be0;
  allocator local_1bb9;
  string local_1bb8;
  anon_class_8_1_8991fb9c local_1b98;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b90;
  allocator local_1b69;
  string local_1b68;
  Command local_1b48;
  allocator local_1ab9;
  string local_1ab8;
  allocator local_1a91;
  string local_1a90;
  anon_class_8_1_8991fb9c local_1a70;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1a68;
  allocator local_1a41;
  string local_1a40;
  Command local_1a20;
  allocator local_1991;
  string local_1990;
  allocator local_1969;
  string local_1968;
  anon_class_8_1_8991fb9c local_1948;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1940;
  allocator local_1919;
  string local_1918;
  Command local_18f8;
  allocator local_1869;
  string local_1868;
  allocator local_1841;
  string local_1840;
  anon_class_8_1_8991fb9c local_1820;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1818;
  allocator local_17f1;
  string local_17f0;
  Command local_17d0;
  allocator local_1741;
  string local_1740;
  allocator local_1719;
  string local_1718;
  anon_class_8_1_8991fb9c local_16f8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_16f0;
  allocator local_16c9;
  string local_16c8;
  Command local_16a8;
  allocator local_1619;
  string local_1618;
  allocator local_15f1;
  string local_15f0;
  anon_class_8_1_8991fb9c local_15d0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_15c8;
  allocator local_15a1;
  string local_15a0;
  Command local_1580;
  allocator local_14f1;
  string local_14f0;
  allocator local_14c9;
  string local_14c8;
  anon_class_8_1_8991fb9c local_14a8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_14a0;
  allocator local_1479;
  string local_1478;
  Command local_1458;
  allocator local_13c9;
  string local_13c8;
  allocator local_13a1;
  string local_13a0;
  anon_class_8_1_8991fb9c local_1380;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1378;
  allocator local_1351;
  string local_1350;
  Command local_1330;
  allocator local_12a1;
  string local_12a0;
  allocator local_1279;
  string local_1278;
  anon_class_8_1_8991fb9c local_1258;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1250;
  allocator local_1229;
  string local_1228;
  Command local_1208;
  allocator local_1179;
  string local_1178;
  allocator local_1151;
  string local_1150;
  anon_class_8_1_8991fb9c local_1130;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1128;
  allocator local_1101;
  string local_1100;
  Command local_10e0;
  allocator local_1051;
  string local_1050;
  allocator local_1029;
  string local_1028;
  anon_class_8_1_8991fb9c local_1008;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1000;
  allocator local_fd9;
  string local_fd8;
  Command local_fb8;
  allocator local_f29;
  string local_f28;
  allocator local_f01;
  string local_f00;
  anon_class_8_1_8991fb9c local_ee0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ed8;
  allocator local_eb1;
  string local_eb0;
  Command local_e90;
  allocator local_e01;
  string local_e00;
  allocator local_dd9;
  string local_dd8;
  anon_class_8_1_8991fb9c local_db8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_db0;
  allocator local_d89;
  string local_d88;
  Command local_d68;
  allocator local_cd9;
  string local_cd8;
  allocator local_cb1;
  string local_cb0;
  anon_class_8_1_8991fb9c local_c90;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_c88;
  allocator local_c61;
  string local_c60;
  Command local_c40;
  allocator local_bb1;
  string local_bb0;
  allocator local_b89;
  string local_b88;
  anon_class_8_1_8991fb9c local_b68;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_b60;
  allocator local_b39;
  string local_b38;
  Command local_b18;
  allocator local_a89;
  string local_a88;
  allocator local_a61;
  string local_a60;
  anon_class_8_1_8991fb9c local_a40;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a38;
  allocator local_a11;
  string local_a10;
  Command local_9f0;
  allocator local_961;
  string local_960;
  allocator local_939;
  string local_938;
  anon_class_8_1_8991fb9c local_918;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_910;
  allocator local_8e9;
  string local_8e8;
  Command local_8c8;
  allocator local_839;
  string local_838;
  allocator local_811;
  string local_810;
  anon_class_8_1_8991fb9c local_7f0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7e8;
  allocator local_7c1;
  string local_7c0;
  Command local_7a0;
  allocator local_711;
  string local_710;
  allocator local_6e9;
  string local_6e8;
  anon_class_8_1_8991fb9c local_6c8;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6c0;
  allocator local_699;
  string local_698;
  Command local_678;
  allocator local_5e9;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  anon_class_8_1_8991fb9c local_5a0;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_598;
  allocator local_571;
  string local_570;
  Command local_550;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  anon_class_8_1_8991fb9c local_478;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_470;
  allocator local_449;
  string local_448;
  Command local_428;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  anon_class_1_0_00000001 local_349;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_348;
  allocator local_321;
  string local_320;
  Command local_300;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  anon_class_8_1_8991fb9c local_228;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_220;
  allocator local_1f9;
  string local_1f8;
  Command local_1d8;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  anon_class_8_1_8991fb9c local_100;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_f8;
  allocator local_c1;
  string local_c0;
  Command local_a0;
  CommandList *local_18;
  CommandList *_commands_local;
  Sandbox *this_local;
  
  local_18 = _commands;
  _commands_local = (CommandList *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"debug",&local_c1);
  local_100.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__0,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_f8,&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"debug[,on|off]",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"show/hide debug elements or return the status of them",&local_149
            );
  Command::Command(&local_a0,&local_c0,&local_f8,&local_120,&local_148,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(_commands,&local_a0);
  Command::~Command(&local_a0);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_f8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"track",&local_1f9);
  local_228.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__1,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_220,&local_228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"track[,on|off|average|samples]",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"start/stop tracking rendering time",&local_271)
  ;
  Command::Command(&local_1d8,&local_1f8,&local_220,&local_248,&local_270,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1d8);
  Command::~Command(&local_1d8);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_220);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"glsl_version",&local_321);
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__2,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_348,&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"glsl_version",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"return GLSL Version",&local_399);
  Command::Command(&local_300,&local_320,&local_348,&local_370,&local_398,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_300);
  Command::~Command(&local_300);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_348);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_448,"error_screen",&local_449);
  local_478.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__3,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_470,&local_478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_498,"error_screen,on|off",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c0,"enable/disable magenta screen on errors",&local_4c1);
  Command::Command(&local_428,&local_448,&local_470,&local_498,&local_4c0,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_428);
  Command::~Command(&local_428);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_470);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"plot",&local_571);
  local_5a0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__4,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_598,&local_5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5c0,"plot[,off|luma|red|green|blue|rgb|fps|ms]",&local_5c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e8,"show/hide a histogram or FPS plot on screen",&local_5e9);
  Command::Command(&local_550,&local_570,&local_598,&local_5c0,&local_5e8,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_550);
  Command::~Command(&local_550);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e9);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_598);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_698,"reset",&local_699);
  local_6c8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__5,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_6c0,&local_6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6e8,"reset",&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"reset timestamp back to zero",&local_711);
  Command::Command(&local_678,&local_698,&local_6c0,&local_6e8,&local_710,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_678);
  Command::~Command(&local_678);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_6c0);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7c0,"time",&local_7c1);
  local_7f0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__6,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_7e8,&local_7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_810,"time",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_838,"return u_time, the elapsed time.",&local_839);
  Command::Command(&local_7a0,&local_7c0,&local_7e8,&local_810,&local_838,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_7a0);
  Command::~Command(&local_7a0);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e8,"defines",&local_8e9);
  local_918.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__7,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_910,&local_918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_938,"defines",&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_960,"return a list of active defines",&local_961);
  Command::Command(&local_8c8,&local_8e8,&local_910,&local_938,&local_960,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_8c8);
  Command::~Command(&local_8c8);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_910);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a10,"uniforms",&local_a11);
  local_a40.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__8,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_a38,&local_a40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a60,
             "uniforms[,all|active|defined|textures|buffers|cubemaps|lights|cameras|on|off]",
             &local_a61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a88,"return a list of uniforms",&local_a89);
  Command::Command(&local_9f0,&local_a10,&local_a38,&local_a60,&local_a88,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_9f0);
  Command::~Command(&local_9f0);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::__cxx11::string::~string((string *)&local_a60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a61);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a38);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b38,"textures",&local_b39);
  local_b68.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__9,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_b60,&local_b68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b88,"textures[,on|off]",&local_b89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_bb0,
             "return a list of textures as their uniform name and path. Or show/hide textures on viewport."
             ,&local_bb1);
  Command::Command(&local_b18,&local_b38,&local_b60,&local_b88,&local_bb0,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_b18);
  Command::~Command(&local_b18);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb1);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator((allocator<char> *)&local_b89);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_b60);
  std::__cxx11::string::~string((string *)&local_b38);
  std::allocator<char>::~allocator((allocator<char> *)&local_b39);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c60,"buffer",&local_c61);
  local_c90.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__10,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_c88,&local_c90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cb0,"buffers[,show|hide]",&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cd8,
             "return a list of buffers as their uniform name. Or show/hide buffer on viewport.",
             &local_cd9);
  Command::Command(&local_c40,&local_c60,&local_c88,&local_cb0,&local_cd8,false);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_c40);
  Command::~Command(&local_c40);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_c88);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_c61);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d88,"cubemaps",&local_d89);
  local_db8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__11,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_db0,&local_db8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_dd8,"cubemaps",&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e00,"print all cubemaps",&local_e01);
  Command::Command(&local_d68,&local_d88,&local_db0,&local_dd8,&local_e00,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_d68);
  Command::~Command(&local_d68);
  std::__cxx11::string::~string((string *)&local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_db0);
  std::__cxx11::string::~string((string *)&local_d88);
  std::allocator<char>::~allocator((allocator<char> *)&local_d89);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_eb0,"cubemap",&local_eb1);
  local_ee0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__12,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_ed8,&local_ee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f00,"cubemap[,on|off|toggle|sh]",&local_f01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f28,"show/hide cubemap or return the spherical harmonics of it",
             &local_f29);
  Command::Command(&local_e90,&local_eb0,&local_ed8,&local_f00,&local_f28,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_e90);
  Command::~Command(&local_e90);
  std::__cxx11::string::~string((string *)&local_f28);
  std::allocator<char>::~allocator((allocator<char> *)&local_f29);
  std::__cxx11::string::~string((string *)&local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ed8);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_fd8,"sky",&local_fd9);
  local_1008.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__13,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1000,&local_1008);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1028,"sky[,on|off]",&local_1029);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1050,"show/hide skybox",&local_1051);
  Command::Command(&local_fb8,&local_fd8,&local_1000,&local_1028,&local_1050,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_fb8);
  Command::~Command(&local_fb8);
  std::__cxx11::string::~string((string *)&local_1050);
  std::allocator<char>::~allocator((allocator<char> *)&local_1051);
  std::__cxx11::string::~string((string *)&local_1028);
  std::allocator<char>::~allocator((allocator<char> *)&local_1029);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1000);
  std::__cxx11::string::~string((string *)&local_fd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fd9);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1100,"sun_elevation",&local_1101);
  local_1130.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__14,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1128,&local_1130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1150,"sun_elevation[,<degrees>]",&local_1151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1178,
             "get or set the sun elevation in degrees (remember to skybox,on).",&local_1179);
  Command::Command(&local_10e0,&local_1100,&local_1128,&local_1150,&local_1178,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_10e0);
  Command::~Command(&local_10e0);
  std::__cxx11::string::~string((string *)&local_1178);
  std::allocator<char>::~allocator((allocator<char> *)&local_1179);
  std::__cxx11::string::~string((string *)&local_1150);
  std::allocator<char>::~allocator((allocator<char> *)&local_1151);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1128);
  std::__cxx11::string::~string((string *)&local_1100);
  std::allocator<char>::~allocator((allocator<char> *)&local_1101);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1228,"sun_azimuth",&local_1229);
  local_1258.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__15,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1250,&local_1258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1278,"sun_azimuth[,<degrees>]",&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_12a0,"get or set the sun azimuth in degrees (remember to skybox,on).",
             &local_12a1);
  Command::Command(&local_1208,&local_1228,&local_1250,&local_1278,&local_12a0,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1208);
  Command::~Command(&local_1208);
  std::__cxx11::string::~string((string *)&local_12a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_12a1);
  std::__cxx11::string::~string((string *)&local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1250);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator((allocator<char> *)&local_1229);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1350,"sky_turbidity",&local_1351);
  local_1380.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__16,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1378,&local_1380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13a0,"sky_turbidity[,<sky_turbidty>]",&local_13a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_13c8,"get or set the sky turbidity.",&local_13c9);
  Command::Command(&local_1330,&local_1350,&local_1378,&local_13a0,&local_13c8,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1330);
  Command::~Command(&local_1330);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c9);
  std::__cxx11::string::~string((string *)&local_13a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13a1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1378);
  std::__cxx11::string::~string((string *)&local_1350);
  std::allocator<char>::~allocator((allocator<char> *)&local_1351);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1478,"lights",&local_1479);
  local_14a8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__17,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_14a0,&local_14a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14c8,"lights",&local_14c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_14f0,"print all light related uniforms",&local_14f1)
  ;
  Command::Command(&local_1458,&local_1478,&local_14a0,&local_14c8,&local_14f0,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1458);
  Command::~Command(&local_1458);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_14f1);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_14a0);
  std::__cxx11::string::~string((string *)&local_1478);
  std::allocator<char>::~allocator((allocator<char> *)&local_1479);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_15a0,"light_position",&local_15a1);
  local_15d0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__18,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_15c8,&local_15d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_15f0,"light_position[[,<index>],<x>,<y>,<z>]",&local_15f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1618,"get or set the light position",&local_1619);
  Command::Command(&local_1580,&local_15a0,&local_15c8,&local_15f0,&local_1618,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1580);
  Command::~Command(&local_1580);
  std::__cxx11::string::~string((string *)&local_1618);
  std::allocator<char>::~allocator((allocator<char> *)&local_1619);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_15c8);
  std::__cxx11::string::~string((string *)&local_15a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_16c8,"light_color",&local_16c9);
  local_16f8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__19,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_16f0,&local_16f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1718,"light_color[,<r>,<g>,<b>]",&local_1719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1740,"get or set the light color",&local_1741);
  Command::Command(&local_16a8,&local_16c8,&local_16f0,&local_1718,&local_1740,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_16a8);
  Command::~Command(&local_16a8);
  std::__cxx11::string::~string((string *)&local_1740);
  std::allocator<char>::~allocator((allocator<char> *)&local_1741);
  std::__cxx11::string::~string((string *)&local_1718);
  std::allocator<char>::~allocator((allocator<char> *)&local_1719);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_16f0);
  std::__cxx11::string::~string((string *)&local_16c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c9);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_17f0,"light_falloff",&local_17f1);
  local_1820.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__20,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1818,&local_1820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1840,"light_falloff[,<value>]",&local_1841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1868,"get or set the light falloff distance",&local_1869);
  Command::Command(&local_17d0,&local_17f0,&local_1818,&local_1840,&local_1868,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_17d0);
  Command::~Command(&local_17d0);
  std::__cxx11::string::~string((string *)&local_1868);
  std::allocator<char>::~allocator((allocator<char> *)&local_1869);
  std::__cxx11::string::~string((string *)&local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1818);
  std::__cxx11::string::~string((string *)&local_17f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17f1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1918,"light_intensity",&local_1919);
  local_1948.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__21,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1940,&local_1948);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1968,"light_intensity[,<value>]",&local_1969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1990,"get or set the light intensity",&local_1991);
  Command::Command(&local_18f8,&local_1918,&local_1940,&local_1968,&local_1990,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_18f8);
  Command::~Command(&local_18f8);
  std::__cxx11::string::~string((string *)&local_1990);
  std::allocator<char>::~allocator((allocator<char> *)&local_1991);
  std::__cxx11::string::~string((string *)&local_1968);
  std::allocator<char>::~allocator((allocator<char> *)&local_1969);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1940);
  std::__cxx11::string::~string((string *)&local_1918);
  std::allocator<char>::~allocator((allocator<char> *)&local_1919);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a40,"camera_distance",&local_1a41);
  local_1a70.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__22,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1a68,&local_1a70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a90,"camera_distance[,<dist>]",&local_1a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1ab8,"get or set the camera distance to the target",&local_1ab9);
  Command::Command(&local_1a20,&local_1a40,&local_1a68,&local_1a90,&local_1ab8,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1a20);
  Command::~Command(&local_1a20);
  std::__cxx11::string::~string((string *)&local_1ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab9);
  std::__cxx11::string::~string((string *)&local_1a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a91);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1a68);
  std::__cxx11::string::~string((string *)&local_1a40);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a41);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b68,"camera_type",&local_1b69);
  local_1b98.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__23,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1b90,&local_1b98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1bb8,"camera_type[,<ortho|perspective>]",&local_1bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1be0,"get or set the camera type",&local_1be1);
  Command::Command(&local_1b48,&local_1b68,&local_1b90,&local_1bb8,&local_1be0,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1b48);
  Command::~Command(&local_1b48);
  std::__cxx11::string::~string((string *)&local_1be0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be1);
  std::__cxx11::string::~string((string *)&local_1bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b90);
  std::__cxx11::string::~string((string *)&local_1b68);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b69);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c90,"camera_fov",&local_1c91);
  local_1cc0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__24,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1cb8,&local_1cc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ce0,"camera_fov[,<field_of_view>]",&local_1ce1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d08,"get or set the camera field of view.",&local_1d09);
  Command::Command(&local_1c70,&local_1c90,&local_1cb8,&local_1ce0,&local_1d08,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1c70);
  Command::~Command(&local_1c70);
  std::__cxx11::string::~string((string *)&local_1d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d09);
  std::__cxx11::string::~string((string *)&local_1ce0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ce1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1cb8);
  std::__cxx11::string::~string((string *)&local_1c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1db8,"camera_position",&local_1db9);
  local_1de8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__25,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1de0,&local_1de8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e08,"camera_position[,<x>,<y>,<z>]",&local_1e09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e30,"get or set the camera position.",&local_1e31);
  Command::Command(&local_1d98,&local_1db8,&local_1de0,&local_1e08,&local_1e30,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1d98);
  Command::~Command(&local_1d98);
  std::__cxx11::string::~string((string *)&local_1e30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e31);
  std::__cxx11::string::~string((string *)&local_1e08);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e09);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1de0);
  std::__cxx11::string::~string((string *)&local_1db8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1db9);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1ee0,"camera_exposure",&local_1ee1);
  local_1f10.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__26,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_1f08,&local_1f10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f30,"camera_exposure[,<aper.>,<shutter>,<sensit.>]",&local_1f31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f58,"get or set the camera exposure values.",&local_1f59);
  Command::Command(&local_1ec0,&local_1ee0,&local_1f08,&local_1f30,&local_1f58,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1ec0);
  Command::~Command(&local_1ec0);
  std::__cxx11::string::~string((string *)&local_1f58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f59);
  std::__cxx11::string::~string((string *)&local_1f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f31);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1f08);
  std::__cxx11::string::~string((string *)&local_1ee0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ee1);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2008,"stream",&local_2009);
  local_2038.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__27,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_2030,&local_2038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2058,"stream,<uniform_name>,stop|play|speed|time[,<value>]",
             &local_2059);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2080,"play/stop or change speed or time of a specific stream",
             &local_2081);
  Command::Command(&local_1fe8,&local_2008,&local_2030,&local_2058,&local_2080,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_1fe8);
  Command::~Command(&local_1fe8);
  std::__cxx11::string::~string((string *)&local_2080);
  std::allocator<char>::~allocator((allocator<char> *)&local_2081);
  std::__cxx11::string::~string((string *)&local_2058);
  std::allocator<char>::~allocator((allocator<char> *)&local_2059);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2030);
  std::__cxx11::string::~string((string *)&local_2008);
  std::allocator<char>::~allocator((allocator<char> *)&local_2009);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2130,"streams",&local_2131);
  local_2160.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__28,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_2158,&local_2160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2180,"streams[,stop|play|restart|speed|prevs[,<value>]]",&local_2181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_21a8,"print all streams or get/set streams speed and previous frames",
             &local_21a9);
  Command::Command(&local_2110,&local_2130,&local_2158,&local_2180,&local_21a8,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_2110);
  Command::~Command(&local_2110);
  std::__cxx11::string::~string((string *)&local_21a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21a9);
  std::__cxx11::string::~string((string *)&local_2180);
  std::allocator<char>::~allocator((allocator<char> *)&local_2181);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2158);
  std::__cxx11::string::~string((string *)&local_2130);
  std::allocator<char>::~allocator((allocator<char> *)&local_2131);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2258,"models",&local_2259);
  local_2288.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__29,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_2280,&local_2288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_22a8,"models[,clear]",&local_22a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_22d0,"print all or clear all loaded models.",&local_22d1);
  Command::Command(&local_2238,&local_2258,&local_2280,&local_22a8,&local_22d0,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_2238);
  Command::~Command(&local_2238);
  std::__cxx11::string::~string((string *)&local_22d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22d1);
  std::__cxx11::string::~string((string *)&local_22a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_2280);
  std::__cxx11::string::~string((string *)&local_2258);
  std::allocator<char>::~allocator((allocator<char> *)&local_2259);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2380,"generate_sdf",&local_2381);
  local_23b0.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__30,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_23a8,&local_23b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_23d0,"generate_sdf[,padding[,resolution]]",&local_23d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_23f8,
             "create an 3D SDF texture of loaded models, default padding = 0.01, resolution = 6",
             &local_23f9);
  Command::Command(&local_2360,&local_2380,&local_23a8,&local_23d0,&local_23f8,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_2360);
  Command::~Command(&local_2360);
  std::__cxx11::string::~string((string *)&local_23f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_23f9);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_23d1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_23a8);
  std::__cxx11::string::~string((string *)&local_2380);
  std::allocator<char>::~allocator((allocator<char> *)&local_2381);
  pCVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24a8,"max_mem_in_queue",&local_24a9);
  local_24d8.this = this;
  std::function<bool(std::__cxx11::string_const&)>::
  function<Sandbox::commandsInit(std::vector<Command,std::allocator<Command>>&)::__31,void>
            ((function<bool(std::__cxx11::string_const&)> *)&local_24d0,&local_24d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_24f8,"max_mem_in_queue[,<bytes>]",&local_24f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2520,
             "set the maximum amount of memory used by a queue to export images to disk",&local_2521
            );
  Command::Command(&local_2488,&local_24a8,&local_24d0,&local_24f8,&local_2520,true);
  std::vector<Command,_std::allocator<Command>_>::push_back(pCVar1,&local_2488);
  Command::~Command(&local_2488);
  std::__cxx11::string::~string((string *)&local_2520);
  std::allocator<char>::~allocator((allocator<char> *)&local_2521);
  std::__cxx11::string::~string((string *)&local_24f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24f9);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_24d0);
  std::__cxx11::string::~string((string *)&local_24a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_24a9);
  if ((this->vert_index != -1) || (this->geom_index != -1)) {
    SceneRender::commandsInit(&this->m_sceneRender,local_18,&this->uniforms);
    SceneRender::uniformsInit(&this->m_sceneRender,&this->uniforms);
  }
  return;
}

Assistant:

void Sandbox::commandsInit(CommandList &_commands ) {

    // Add Sandbox Commands
    // ----------------------------------------
    _commands.push_back(Command("debug", [&](const std::string& _line){
        if (_line == "debug") {
            std::string rta = m_showPasses ? "on" : "off";
            std::cout << "buffers," << rta << std::endl; 
            rta = m_showTextures ? "on" : "off";
            std::cout << "textures," << rta << std::endl;
            if (uniforms.models.size() > 0) {
                rta = m_sceneRender.showGrid ? "on" : "off";
                std::cout << "grid," << rta << std::endl; 
                rta = m_sceneRender.showAxis ? "on" : "off";
                std::cout << "axis," << rta << std::endl; 
                rta = m_sceneRender.showBBoxes ? "on" : "off";
                std::cout << "bboxes," << rta << std::endl;
            }
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                m_showPasses = (values[1] == "on");
                m_showTextures = (values[1] == "on");
                console_uniforms( values[1] == "on" );
                // m_plot = (values[1] == "on")? 1 : 0;
                if (uniforms.models.size() > 0) {
                    m_sceneRender.showGrid = (values[1] == "on");
                    m_sceneRender.showAxis = (values[1] == "on");
                    m_sceneRender.showBBoxes = (values[1] == "on");
                    if (values[1] == "on")
                        addDefine("DEBUG", values[1]);
                    else
                        delDefine("DEBUG");
                }
                // if (values[1] == "on") {
                //     m_plot = PLOT_FPS;
                //     m_plot_shader.addDefine("PLOT_VALUE", "color.rgb += digits(uv * 0.1 + vec2(0.105, -0.01), value.r * 60.0, 1.0);");
                // }
                // else {
                //     m_plot = PLOT_OFF;
                //     m_plot_shader.delDefine("PLOT_VALUE");
                // }
                return true;
            }
        }
        return false;
    },
    "debug[,on|off]", "show/hide debug elements or return the status of them", false));

    _commands.push_back(Command("track", [&](const std::string& _line){
        if (_line == "track") {
            std::cout << "track," << (uniforms.tracker.isRunning() ? "on" : "off") << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {

                if ((values[1] == "on" || values[1] == "start" | values[1] == "begin") &&
                    !uniforms.tracker.isRunning() ) 
                    uniforms.tracker.start();
                else if (   (values[1] == "off" || values[1] == "stop" | values[1] == "end") &&
                            uniforms.tracker.isRunning() ) 
                    uniforms.tracker.stop();
                    
                else if (values[1] == "average") 
                    std::cout << uniforms.tracker.logAverage();

                else if (values[1] == "samples")
                    std::cout << uniforms.tracker.logSamples();

                else if (values[1] == "framerate")
                    std::cout << uniforms.tracker.logFramerate();
            }

            else if (values.size() == 3) {

                if (values[1] == "average" && 
                    vera::haveExt(values[2],"csv") ) {
                    std::ofstream out(values[2]);
                    out << uniforms.tracker.logAverage();
                    out.close();
                }

                else if (values[1] == "average")
                    std::cout << uniforms.tracker.logAverage( values[2] );

                else if (   values[1] == "samples" && 
                            vera::haveExt(values[2],"csv") ) {
                    std::ofstream out(values[2]);
                    out << "track,timeStampMs,durationMs\n";
                    out << uniforms.tracker.logSamples();
                    out.close();
                }

                else if (values[1] == "samples")
                    std::cout << uniforms.tracker.logSamples(values[2]);
                    
            }
            else if (values.size() == 4) {

                if (values[1] == "average" && 
                    vera::haveExt(values[3],"csv") ) {
                    std::ofstream out( values[3] );
                    out << uniforms.tracker.logAverage( values[2] );
                    out.close();
                }

                else if (   values[1] == "samples" && 
                    vera::haveExt(values[3],"csv") ) {
                    std::ofstream out( values[3] );
                    out << uniforms.tracker.logSamples( values[2] );
                    out.close();
                }

            }

        }
        return false;
    },
    "track[,on|off|average|samples]", "start/stop tracking rendering time", false));

    _commands.push_back(Command("glsl_version", [&](const std::string& _line){ 
        if (_line == "glsl_version") {
            // Force the output in floats
            std::cout << vera::getVersion() << std::endl;
            return true;
        }
        return false;
    },
    "glsl_version", "return GLSL Version", false));

    _commands.push_back(Command("error_screen", [&](const std::string& _line){ 
        if (_line == "error_screen") {
            std::string rta = (m_error_screen == vera::SHOW_MAGENTA_SHADER) ? "on" : "off";
            std::cout << "error_screen," << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                m_error_screen = (values[1] == "on")? vera::SHOW_MAGENTA_SHADER : vera::REVERT_TO_PREVIOUS_SHADER;
                return true;
            }
        }
        return false;
    },
    "error_screen,on|off", "enable/disable magenta screen on errors", false));

    _commands.push_back(Command("plot", [&](const std::string& _line){
        if (_line == "plot") {
            std::cout << "plot," << plot_options[m_plot] << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values[0] == "plot" && values.size() == 2) {
                m_plot_shader.setSource(vera::getDefaultSrc(vera::FRAG_PLOT), vera::getDefaultSrc(vera::VERT_DYNAMIC_BILLBOARD));
                m_plot_shader.delDefine("PLOT_VALUE");

                using plot_value_display_t = std::tuple<std::string, PlotType, std::string>;
                const std::vector<plot_value_display_t> plot_metadata = {
                    {"off", PLOT_OFF, ""}
                    , {"luma", PLOT_LUMA, "color.rgb = vec3(step(st.y, data.a)); color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"red", PLOT_RED, "color.rgb = vec3(step(st.y, data.r), 0.0, 0.0);  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"green", PLOT_GREEN, "color.rgb = vec3(0.0, step(st.y, data.g), 0.0);  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"blue", PLOT_BLUE, "color.rgb = vec3(0.0, 0.0, step(st.y, data.b));  color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"rgb", PLOT_RGB, "color += stroke(fract(st.x * 5.0), 0.5, 0.025) * 0.1;"}
                    , {"fps", PLOT_FPS,"color.rgb += digits(uv * 0.1 + vec2(0.0, -0.01), value.r * 60.0, 1.0); color += stroke(fract(st.y * 3.0), 0.5, 0.05) * 0.1;"}
                    , {"ms", PLOT_MS, "color.rgb += digits(uv * 0.1 + vec2(0.105, -0.01), value.r * 60.0, 1.0); color += stroke(fract(st.y * 3.0), 0.5, 0.05) * 0.1;"}
                };

                if (values[1] == "toggle") {
                    auto carousel = std::vector<PlotType>{PLOT_OFF, PLOT_LUMA, PLOT_RGB, PLOT_FPS};
                    const auto it = std::find_if(std::begin(carousel), std::end(carousel), [&](const PlotType& s){return m_plot == s;});
                    if(it != std::end(carousel)) {
                        std::rotate(std::begin(carousel), std::next(it), std::end(carousel));
                        const auto it = std::find_if(std::begin(plot_metadata), std::end(plot_metadata), [&](const plot_value_display_t& s){return carousel.front() == std::get<1>(s);});
                        values[1] = std::get<0>(*it);
                    }
                }

                if (values[1] == "off") 
                    m_plot = PLOT_OFF;
                else {
                    const auto it = std::find_if(std::begin(plot_metadata), std::end(plot_metadata), [&](const plot_value_display_t& i){return std::get<0>(i) == values[1];});
                    if(it != std::end(plot_metadata)) {
                        m_plot = std::get<1>(*it);
                        m_plot_shader.addDefine("PLOT_VALUE", std::get<2>(*it));
                    }
                }
                m_update_buffers = true;
                return true;
            }
        }
        return false;
    },
    "plot[,off|luma|red|green|blue|rgb|fps|ms]", "show/hide a histogram or FPS plot on screen", false));

    _commands.push_back(Command("reset", [&](const std::string& _line){
        if (_line == "reset") {
            m_time_offset = vera::getTime();
            return true;
        }
        return false;
    },
    "reset", "reset timestamp back to zero", false));

    _commands.push_back(Command("time", [&](const std::string& _line){ 
        if (_line == "time") {
            // Force the output in floats
            std::cout << std::setprecision(6) << (vera::getTime() - m_time_offset) << std::endl;
            return true;
        }
        return false;
    },
    "time", "return u_time, the elapsed time.", false));

    _commands.push_back(Command("defines", [&](const std::string& _line){ 
        if (_line == "defines") {
            if (uniforms.models.size() > 0) {
                m_sceneRender.printDefines();
                uniforms.printDefines();
            }
            else
                m_canvas_shader.printDefines();
            
            return true;
        }
        return false;
    },
    "defines", "return a list of active defines", false));
    
    _commands.push_back(Command("uniforms", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (values[0] != "uniforms")
            return false;

        if (values.size() == 1) {
            uniforms.printAvailableUniforms(false);
            uniforms.printDefinedUniforms();
            return true;
        }
        else if (values[1] == "all") {
            uniforms.printAvailableUniforms(true);
            uniforms.printDefinedUniforms();
            uniforms.printBuffers();
            uniforms.printTextures();
            uniforms.printStreams();
            uniforms.printCubemaps();
            uniforms.printLights();
            uniforms.printCameras();
            m_sceneRender.printBuffers();
            return true;
        }
        else if (values[1] == "active") {
            uniforms.printAvailableUniforms(false);
            uniforms.printDefinedUniforms();
            return true;
        }
        else if (values[1] == "defined") {
            uniforms.printDefinedUniforms(true);
            return true;
        }
        else if (values[1] == "textures") {
            uniforms.printTextures();
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            uniforms.printStreams();
            return true;
        }
        else if (values[1] == "buffers") {
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            return true;
        }
        else if (values[1] == "streams") {
            uniforms.printStreams();
            return true;
        }
        else if (values[1] == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        }
        else if (values[1] == "cameras") {
            uniforms.printCameras();
            return true;
        }
        else if (values[1] == "lights") {
            uniforms.printLights();
            return true;
        }
        else if (values[1] == "on" || values[1] == "off") { 
            console_uniforms( values[1] == "on" );
            return true; 
        }

        return false;
    },
    "uniforms[,all|active|defined|textures|buffers|cubemaps|lights|cameras|on|off]", "return a list of uniforms", false));

    _commands.push_back(Command("textures", [&](const std::string& _line){ 
        if (_line == "textures") {
            uniforms.printTextures();
            uniforms.printStreams();
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_showTextures ? "off" : "on";

                m_showTextures = (values[1] == "on");
                return true;
            }
        }
        return false;
    },
    "textures[,on|off]", "return a list of textures as their uniform name and path. Or show/hide textures on viewport.", false));

    _commands.push_back(Command("buffer", [&](const std::string& _line){ 
        if (_line == "buffers") {
            uniforms.printBuffers();
            m_sceneRender.printBuffers();
            if (m_postprocessing) {
                if (lenticular.size() > 0)
                    std::cout << "LENTICULAR";
                else if (fxaa)
                    std::cout << "FXAA";
                else
                    std::cout << "Custom";
                std::cout << " postProcessing pass" << std::endl;
                return true;
            }
            
            return false;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');

            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_showPasses ? "off" : "on";

                m_showPasses = (values[1] == "on" || values[1] == "show");
                return true;
            }
            else if (values.size() == 3) {
                size_t i = vera::toInt(values[1]);
                if (i < uniforms.buffers.size())
                    uniforms.buffers[i]->enabled = (values[1] == "on");
            }
        }
        return false;
    },
    "buffers[,show|hide]", "return a list of buffers as their uniform name. Or show/hide buffer on viewport.", false));

    // CUBEMAPS
    _commands.push_back(Command("cubemaps", [&](const std::string& _line){
        if (_line == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        }
        return false;
    },
    "cubemaps", "print all cubemaps"));

    _commands.push_back(Command("cubemap", [&](const std::string& _line){
        if (_line == "cubemaps") {
            uniforms.printCubemaps();
            return true;
        } else if (_line == "cubemap") {
            std::string rta = m_sceneRender.showCubebox ? "on" : "off";
            std::cout << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "sh") {
                    uniforms.printCubemapSH();
                    return true;
                }
                if (values[1] == "toggle")
                    values[1] = m_sceneRender.showCubebox ? "off" : "on";

                m_sceneRender.showCubebox = values[1] == "on";
                if (values[1] == "on") {
                    addDefine("SCENE_SH_ARRAY", "u_SH");
                    addDefine("SCENE_CUBEMAP", "u_cubeMap");
                }
                else if (values[1] == "off") {
                    delDefine("SCENE_SH_ARRAY");
                    delDefine("SCENE_CUBEMAP");
                }
                return true;
            }
        }
        return false;
    },
    "cubemap[,on|off|toggle|sh]", "show/hide cubemap or return the spherical harmonics of it"));

    _commands.push_back(Command("sky", [&](const std::string& _line){
        if (_line == "sky") {
            std::string rta = m_sceneRender.showCubebox ? "on" : "off";
            std::cout << rta << std::endl; 
            return true;
        }
        else {
            std::vector<std::string> values = vera::split(_line,',');
            if (values.size() == 2) {
                if (values[1] == "toggle")
                    values[1] = m_sceneRender.showCubebox ? "off" : "on";

                m_sceneRender.showCubebox = values[1] == "on";
                if (values[1] == "on") {
                    uniforms.activeCubemap = uniforms.cubemaps["default"];
                    addDefine("SCENE_SH_ARRAY", "u_SH");
                    addDefine("SCENE_CUBEMAP", "u_cubeMap");
                }
                else if (values[1] == "off") {
                    delDefine("SCENE_SH_ARRAY");
                    delDefine("SCENE_CUBEMAP");
                }
                return true;
            }
        }
        return false;
    },
    "sky[,on|off]", "show/hide skybox"));

    _commands.push_back(Command("sun_elevation", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {

            float elevation = glm::radians( vera::toFloat(values[1]) );
            float azimuth = uniforms.getSunAzimuth();

            addDefine("SCENE_SH_ARRAY", "u_SH");
            addDefine("SCENE_CUBEMAP", "u_cubeMap");
            addDefine("SUN", "u_light");
            uniforms.setSunPosition(azimuth, elevation, glm::length( uniforms.lights["default"]->getPosition() ));
            uniforms.activeCubemap = uniforms.cubemaps["default"];
            return true;
        }
        else {
            std::cout << uniforms.getSunElevation() << std::endl;
            return true;
        }
        return false;
    },
    "sun_elevation[,<degrees>]", "get or set the sun elevation in degrees (remember to skybox,on)."));

    _commands.push_back(Command("sun_azimuth", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {

            float elevation = uniforms.getSunElevation();
            float azimuth = glm::radians( vera::toFloat(values[1]) );

            addDefine("SUN", "u_light");
            addDefine("SCENE_SH_ARRAY", "u_SH");
            addDefine("SCENE_CUBEMAP", "u_cubeMap");
            uniforms.setSunPosition(azimuth, elevation, glm::length( uniforms.lights["default"]->getPosition() ) );
            uniforms.activeCubemap = uniforms.cubemaps["default"];

            return true;
        }
        else {
            std::cout << uniforms.getSunAzimuth() << std::endl;
            return true;
        }
        return false;
    },
    "sun_azimuth[,<degrees>]", "get or set the sun azimuth in degrees (remember to skybox,on)."));

    _commands.push_back(Command("sky_turbidity", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.setSkyTurbidity( vera::toFloat(values[1]) );
            uniforms.activeCubemap = uniforms.cubemaps["default"];
            return true;
        }
        else {
            std::cout << uniforms.getSkyTurbidity() << std::endl;
            return true;
        }
        return false;
    },
    "sky_turbidity[,<sky_turbidty>]", "get or set the sky turbidity."));

    // LIGTH
    _commands.push_back(Command("lights", [&](const std::string& _line){ 
        if (_line == "lights") {
            uniforms.printLights();
            return true;
        }
        return false;
    },
    "lights", "print all light related uniforms"));

    _commands.push_back(Command("light_position", [&](const std::string& _line){ 
        
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            if (uniforms.lights.size() == 1)
                uniforms.setSunPosition( glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])) );
            
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i)
        //         uniforms.lights[i].setPosition(glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4])));

        //     return true;
        // }
        else {
            glm::vec3 pos = uniforms.lights["default"]->getPosition();
            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
            return true;
        }
        return false;
    },
    "light_position[[,<index>],<x>,<y>,<z>]", "get or set the light position"));

    _commands.push_back(Command("light_color", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            vera::Light* sun = uniforms.lights["default"];
            sun->color = glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3]));
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].color = glm::vec3(vera::toFloat(values[2]), vera::toFloat(values[3]), vera::toFloat(values[4]));
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            glm::vec3 color = uniforms.lights["default"]->color;
            std::cout << color.x << ',' << color.y << ',' << color.z << std::endl;
            return true;
        }
        return false;
    },
    "light_color[,<r>,<g>,<b>]", "get or set the light color"));

    _commands.push_back(Command("light_falloff", [&](const std::string& _line){ 
         std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            vera::Light* sun = uniforms.lights["default"];
            sun->falloff = vera::toFloat(values[1]);
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].falloff = vera::toFloat(values[2]);
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            std::cout << uniforms.lights["default"]->falloff << std::endl;
            return true;
        }
        return false;
    },
    "light_falloff[,<value>]", "get or set the light falloff distance"));

    _commands.push_back(Command("light_intensity", [&](const std::string& _line){ 
         std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            vera::Light* sun = uniforms.lights["default"];
            sun->intensity = vera::toFloat(values[1]);
            sun->bChange = true;
            return true;
        }
        // else if (values.size() == 5) {
        //     size_t i = vera::toInt(values[1]);
        //     if (uniforms.lights.size() > i) {
        //         uniforms.lights[i].intensity = vera::toFloat(values[2]);
        //         uniforms.lights[i].bChange = true;
        //     }
        //     return true;
        // }
        else {
            std::cout <<  uniforms.lights["default"]->intensity << std::endl;
            return true;
        }
        return false;
    },
    "light_intensity[,<value>]", "get or set the light intensity"));

    // CAMERA
    _commands.push_back(Command("camera_distance", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.activeCamera->setDistance(vera::toFloat(values[1]));
            return true;
        }
        else {
            
            std::cout << uniforms.activeCamera->getDistance() << std::endl;
            return true;
        }
        return false;
    },
    "camera_distance[,<dist>]", "get or set the camera distance to the target"));

    _commands.push_back(Command("camera_type", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            if (values[1] == "ortho")
                uniforms.activeCamera->setProjection(vera::ProjectionType::ORTHO);
            else if (values[1] == "perspective")
                uniforms.activeCamera->setProjection(vera::ProjectionType::PERSPECTIVE);
            return true;
        }
        else {
            vera::ProjectionType type = uniforms.activeCamera->getProjectionType();
            if (type == vera::ProjectionType::ORTHO)
                std::cout << "ortho" << std::endl;
            else
                std::cout << "perspective" << std::endl;
            
            return true;
        }
        return false;
    },
    "camera_type[,<ortho|perspective>]", "get or set the camera type"));

    _commands.push_back(Command("camera_fov", [&](const std::string& _line){ 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 2) {
            uniforms.activeCamera->setFOV( glm::radians(vera::toFloat(values[1])) );
            return true;
        }
        else {
            std::cout << glm::degrees(uniforms.activeCamera->getFOV()) << std::endl;
            return true;
        }
        return false;
    },
    "camera_fov[,<field_of_view>]", "get or set the camera field of view."));

    _commands.push_back(Command("camera_position", [&](const std::string& _line) {
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            uniforms.activeCamera->setPosition( -glm::vec3(vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3])));
            uniforms.activeCamera->lookAt( uniforms.activeCamera->getTarget() );
            glm::vec3 v = uniforms.activeCamera->getPosition();
            m_camera_azimuth = glm::degrees( atan2(v.x, v.z) );
            m_camera_elevation = glm::degrees( atan2(-v.y, sqrt(v.x * v.x + v.z * v.z)) );
            return true;
        }
        else {
            glm::vec3 pos = -uniforms.activeCamera->getPosition();
            std::cout << pos.x << ',' << pos.y << ',' << pos.z << std::endl;
            return true;
        }
        return false;
    },
    "camera_position[,<x>,<y>,<z>]", "get or set the camera position."));

    _commands.push_back(Command("camera_exposure", [&](const std::string& _line) { 
        if (!uniforms.activeCamera) 
            return false;

        std::vector<std::string> values = vera::split(_line,',');
        if (values.size() == 4) {
            uniforms.activeCamera->setExposure( vera::toFloat(values[1]), vera::toFloat(values[2]), vera::toFloat(values[3]));
            return true;
        }
        else {
            std::cout << uniforms.activeCamera->getExposure() << std::endl;
            return true;
        }
        return false;
    },
    "camera_exposure[,<aper.>,<shutter>,<sensit.>]", "get or set the camera exposure values."));

     _commands.push_back(Command("stream", [&](const std::string& _line) { 
        std::vector<std::string> values = vera::split(_line,',');

        if (values.size() == 3) {
            if ( values[2] == "play") {
                uniforms.setStreamPlay( values[1] );
                return true;
            }
            else if ( values[2] == "stop") {
                uniforms.setStreamStop( values[1] );
                return true;
            }
            else if ( values[2] == "restart") {
                uniforms.setStreamRestart( values[1] );
                return true;
            }
            else if ( values[2] == "speed") {
                std::cout << uniforms.getStreamSpeed( values[1] ) << std::endl;
                return true;
            }
            else if ( values[2] == "time") {
                std::cout << uniforms.getStreamTime( values[1] ) << std::endl;
                return true;
            }
            else if ( values[2] == "pct") {
                std::cout << uniforms.getStreamPct( values[1] ) << std::endl;
                return true;
            }
        }
        else if (values.size() == 4) {
            if ( values[2] == "speed") {
                uniforms.setStreamSpeed( values[1], vera::toFloat(values[3]) );
                return true;
            }
            else if ( values[2] == "time") {
                uniforms.setStreamTime( values[1], vera::toFloat(values[3]) );
                return true;
            }
            else if ( values[2] == "pct") {
                uniforms.setStreamPct( values[1], vera::toFloat(values[3]) );
                return true;
            }
        }

        return false;
    },
    "stream,<uniform_name>,stop|play|speed|time[,<value>]", "play/stop or change speed or time of a specific stream"));

    _commands.push_back(Command("streams", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (_line == "streams")
            uniforms.printStreams();

        else if (values.size() == 2) {
            if ( values[1] == "stop") {
                uniforms.setStreamsStop();
                return true;
            }
            else if ( values[1] == "play") {
                uniforms.setStreamsPlay();
                return true;
            }
            else if ( values[1] == "restart") {
                uniforms.setStreamsRestart();
                return true;
            }
        }
        else if (values.size() == 3) {
            if ( values[1] == "speed") {
                uniforms.setStreamsSpeed( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "time") {
                uniforms.setStreamsTime( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "pct") {
                uniforms.setStreamsPct( vera::toFloat(values[2]) );
                return true;
            }
            else if ( values[1] == "prevs") {
                int prevs = vera::toInt(values[2]);

                if (prevs == 0) {
                    uniforms.setStreamsPrevs( 0 );
                    delDefine("STREAMS_PREVS");
                }
                else {
                    uniforms.setStreamsPrevs( vera::toInt(values[2]) );
                    addDefine("STREAMS_PREVS", values[2]);
                }
                return true;
            }
        }

        return false;
    },
    "streams[,stop|play|restart|speed|prevs[,<value>]]", "print all streams or get/set streams speed and previous frames"));

    _commands.push_back(Command("models", [&](const std::string& _line){ 
        std::vector<std::string> values = vera::split(_line,',');

        if (_line == "models") {
            uniforms.printModels();
            return true;
        }
        else if (values.size() == 2) {
            if ( values[1] == "clear") {
                uniforms.clearModels();
                m_sceneRender.clearScene();
                return true;
            }
        }
        
        return false;
    },
    "models[,clear]", "print all or clear all loaded models."));

    _commands.push_back(Command("generate_sdf", [&](const std::string& _line) { 
        if (geom_index != -1) {
            std::vector<std::string> values = vera::split(_line,',');
            float padding = 0.01f;
            if (values.size() > 1)
                padding = vera::toFloat(values[1]);

            for (vera::ModelsMap::iterator it = uniforms.models.begin(); it != uniforms.models.end(); ++it) {
                std::string name = "u_" + it->first + "Sdf";
                addDefine("MODEL_SDF_TEXTURE", name );

                clock_t start, end;
                start = clock();

                vera::Mesh mesh = it->second->mesh;
                mesh.setMaterial(it->second->mesh.getMaterial());
                vera::center(mesh);
                
                std::vector<vera::Triangle> tris = mesh.getTriangles();
                vera::BVH acc(tris, vera::SPLIT_MIDPOINT );
                acc.square();

                // // Calculate scale difference between model and SDF
                // vera::BoundingBox bbox  = it->second->getBoundingBox();
                // float area = bbox.getArea();
                // glm::vec3   bdiagonal   = bbox.getDiagonal();
                // float       max_dist    = glm::length(bdiagonal);
                // bbox.expand( (max_dist*max_dist) * padding );
                // it->second->addDefine("MODEL_SDF_SCALE", vera::toString(2.0f-bbox.getArea()/area) );

                int voxel_resolution_lod_0  = std::pow(2, 2);
                glm::vec3   bdiagonal       = acc.getDiagonal();
                float       max_dist        = glm::length(bdiagonal);
                acc.expand( (max_dist*max_dist) * padding );

                std::vector<vera::Image> current_lod;
                for (int z = 0; z < voxel_resolution_lod_0; z++)
                    current_lod.push_back( vera::toSdfLayer( &acc, voxel_resolution_lod_0, z) );
                
                uniforms.loadMutex.lock();
                uniforms.loadQueue[ name ] = packSprite(current_lod);
                uniforms.loadMutex.unlock();
                addDefine("MODEL_SDF_VOXEL_RESOLUTION", vera::toString(voxel_resolution_lod_0) + ".0" );
                addDefine("MODEL_SDF_TEXTURE_RESOLUTION", "vec2(" + vera::toString( uniforms.loadQueue[ name ].getWidth() ) + ".0)" );

                size_t lod_total = 4;
                for (int l = 1; l < lod_total; l++) {
                    std::vector<vera::Image> new_lod = vera::scaleSprite(current_lod, 4);
                    uniforms.loadMutex.lock();
                    uniforms.loadQueue[ name ] = vera::packSprite(new_lod);
                    uniforms.loadMutex.unlock();
                    addDefine("MODEL_SDF_VOXEL_RESOLUTION", vera::toString(new_lod.size()) + ".0" );
                    addDefine("MODEL_SDF_TEXTURE_RESOLUTION", "vec2(" + vera::toString( uniforms.loadQueue[ name ].getWidth() ) + ".0)" );

                    if (l < (lod_total-1)) {
                        for (int z = 0; z < new_lod.size(); z++) {
                            new_lod[z] = vera::toSdfLayer( &acc, new_lod.size(), z);
                            console_draw_pct( float(z) / float(new_lod.size() - 1) );
                            uniforms.loadMutex.lock();
                            uniforms.loadQueue[ name ] = vera::packSprite(new_lod);
                            uniforms.loadMutex.unlock();
                        }
                    }
                    
                    current_lod = new_lod;
                }

                end = clock();
                double duration_sec = double(end-start)/CLOCKS_PER_SEC;
                std::cout << "Took " << duration_sec << "secs" << std::endl;
            }

            return true;
        }
        return false;
    },
    "generate_sdf[,padding[,resolution]]", "create an 3D SDF texture of loaded models, default padding = 0.01, resolution = 6"));


    #if defined(SUPPORT_MULTITHREAD_RECORDING)
    _commands.push_back(Command("max_mem_in_queue", [&](const std::string & line) {
        std::vector<std::string> values = vera::split(line,',');
        if (values.size() == 2) {
            m_max_mem_in_queue = std::stoll(values[1]);
        }
        else {
            std::cout << m_max_mem_in_queue.load() << std::endl;
        }
        return false;
    }, "max_mem_in_queue[,<bytes>]", "set the maximum amount of memory used by a queue to export images to disk"));
    #endif

    if (vert_index != -1 || geom_index != -1) {
        m_sceneRender.commandsInit(_commands, uniforms);
        m_sceneRender.uniformsInit(uniforms);
    }
}